

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

ByteArray __thiscall asl::File::firstBytes(File *this,int n)

{
  int iVar1;
  ssize_t sVar2;
  size_t in_RCX;
  uint in_EDX;
  undefined4 in_register_00000034;
  File *this_00;
  
  this_00 = (File *)CONCAT44(in_register_00000034,n);
  Array<unsigned_char>::alloc((Array<unsigned_char> *)this,in_EDX);
  if ((this_00->_file == (FILE *)0x0) &&
     (iVar1 = open(this_00,(char *)&this_00->_path,0), (char)iVar1 == '\0')) {
    Array<unsigned_char>::clear((Array<unsigned_char> *)this);
    return (ByteArray)(uchar *)this;
  }
  sVar2 = read(this_00,(int)this->_file,(void *)(ulong)in_EDX,in_RCX);
  Array<unsigned_char>::resize((Array<unsigned_char> *)this,(int)sVar2);
  return (ByteArray)(uchar *)this;
}

Assistant:

ByteArray File::firstBytes(int n)
{
	ByteArray data(n);
	if (!_file && !open(_path)) {
		data.clear();
		return data;
	}
	data.resize(read(&data[0], n));
	return data;
}